

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

Vec_Int_t * Ree_ManDeriveAdds(Hash_IntMan_t *p,Vec_Int_t *vData,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Wec_t *p_03;
  Vec_Wec_t *p_04;
  Hash_IntObj_t *pHVar7;
  int *piVar8;
  int Addition;
  int iVar9;
  long lVar10;
  uint i;
  uint i_00;
  Vec_Int_t *p_05;
  Vec_Wec_t *p_06;
  int iVar11;
  
  iVar11 = p->vObjs->nSize / 4;
  p_00 = Vec_IntAlloc(1000);
  pVVar5 = Vec_IntStart(iVar11);
  pVVar6 = Vec_IntStart(iVar11);
  p_01 = Vec_IntAlloc(iVar11);
  p_01->nSize = iVar11;
  if (p_01->pArray != (int *)0x0) {
    memset(p_01->pArray,0xff,(long)iVar11 << 2);
  }
  p_02 = Vec_IntAlloc(1000);
  for (iVar9 = 1; iVar9 + 1 < vData->nSize; iVar9 = iVar9 + 3) {
    Vec_IntEntry(vData,iVar9 + -1);
    iVar1 = Vec_IntEntry(vData,iVar9);
    iVar2 = Vec_IntEntry(vData,iVar9 + 1);
    if (iVar11 <= iVar1) {
      __assert_fail("Value <= nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                    ,0x154,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
    }
    if ((0x33 < iVar2 - 0x66U) ||
       (p_05 = pVVar5, (0x9000000000009U >> ((ulong)(iVar2 - 0x66U) & 0x3f) & 1) == 0)) {
      p_05 = pVVar6;
    }
    Vec_IntAddToEntry(p_05,iVar1,Addition);
  }
  iVar9 = 0;
  iVar11 = pVVar5->nSize;
  if (pVVar5->nSize < 1) {
    iVar11 = 0;
  }
  for (iVar1 = 0; iVar11 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(pVVar5,iVar1);
    iVar3 = Vec_IntEntry(pVVar6,iVar1);
    if ((iVar2 != 0) && (iVar3 != 0)) {
      Vec_IntPush(p_02,iVar1);
      Vec_IntWriteEntry(p_01,iVar1,iVar9);
      iVar9 = iVar9 + 1;
    }
  }
  Vec_IntFree(pVVar5);
  Vec_IntFree(pVVar6);
  p_03 = Vec_WecStart(iVar9);
  p_04 = Vec_WecStart(iVar9);
  for (iVar11 = 1; iVar11 + 1 < vData->nSize; iVar11 = iVar11 + 3) {
    iVar9 = Vec_IntEntry(vData,iVar11 + -1);
    iVar1 = Vec_IntEntry(vData,iVar11);
    iVar2 = Vec_IntEntry(vData,iVar11 + 1);
    iVar1 = Vec_IntEntry(p_01,iVar1);
    if (iVar1 != -1) {
      if ((0x33 < iVar2 - 0x66U) ||
         (p_06 = p_03, (0x9000000000009U >> ((ulong)(iVar2 - 0x66U) & 0x3f) & 1) == 0)) {
        p_06 = p_04;
      }
      pVVar5 = Vec_WecEntry(p_06,iVar1);
      Vec_IntPushTwo(pVVar5,iVar9,iVar2);
    }
  }
  Vec_IntFree(p_01);
  iVar9 = 0;
  iVar11 = p_02->nSize;
  if (p_02->nSize < 1) {
    iVar11 = iVar9;
  }
  do {
    if (iVar9 == iVar11) {
      Vec_IntFree(p_02);
      Vec_WecFree(p_03);
      Vec_WecFree(p_04);
      return p_00;
    }
    iVar1 = Vec_IntEntry(p_02,iVar9);
    pVVar5 = Vec_WecEntry(p_03,iVar9);
    pVVar6 = Vec_WecEntry(p_04,iVar9);
    pHVar7 = Hash_IntObj(p,iVar1);
    for (i_00 = 0; (int)(i_00 | 1) < pVVar5->nSize; i_00 = i_00 + 2) {
      iVar1 = Vec_IntEntry(pVVar5,i_00);
      iVar2 = Vec_IntEntry(pVVar5,i_00 | 1);
      for (i = 0; (int)(i | 1) < pVVar6->nSize; i = i + 2) {
        iVar3 = Vec_IntEntry(pVVar6,i);
        iVar4 = Vec_IntEntry(pVVar6,i | 1);
        piVar8 = &DAT_0083fac0;
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          if (iVar4 == *piVar8) goto LAB_00535fff;
          piVar8 = piVar8 + 1;
        }
        piVar8 = &DAT_0083faa0;
        lVar10 = 0;
        while( true ) {
          if (lVar10 == 8) {
            __assert_fail("n < 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                          ,0x186,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
          }
          if (iVar4 == *piVar8) break;
          lVar10 = lVar10 + 1;
          piVar8 = piVar8 + 1;
        }
LAB_00535fff:
        Vec_IntPushThree(p_00,pHVar7->iData0,pHVar7->iData1,pHVar7->iData2);
        Vec_IntPushThree(p_00,iVar1,iVar3,(uint)lVar10 | (uint)(iVar2 == 0x69 || iVar2 == 0x99) << 3
                        );
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Ree_ManDeriveAdds( Hash_IntMan_t * p, Vec_Int_t * vData, int fVerbose )
{
    int i, j, k, iObj, iObj2, Value, Truth, Truth2, CountX, CountM, Index = 0;
    int nEntries = Hash_IntManEntryNum(p);
    Vec_Int_t * vAdds = Vec_IntAlloc( 1000 );
    Vec_Int_t * vXors = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vMajs = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vIndex = Vec_IntStartFull( nEntries + 1 );
    Vec_Int_t * vIndexRev = Vec_IntAlloc( 1000 );
    Vec_Wec_t * vXorMap, * vMajMap;
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        assert( Value <= nEntries );
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntAddToEntry( vXors, Value, 1 );
        else
            Vec_IntAddToEntry( vMajs, Value, 1 );
    }
    // remap these into indexes
    Vec_IntForEachEntryTwo( vXors, vMajs, CountX, CountM, i )
        if ( CountX && CountM )
        {
            Vec_IntPush( vIndexRev, i );
            Vec_IntWriteEntry( vIndex, i, Index++ );
        }
    Vec_IntFree( vXors );
    Vec_IntFree( vMajs );
    //if ( fVerbose )
    //    printf( "Detected %d shared cuts among %d hashed cuts.\n", Index, nEntries );
    // collect nodes
    vXorMap = Vec_WecStart( Index );
    vMajMap = Vec_WecStart( Index );
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        Index = Vec_IntEntry( vIndex, Value );
        if ( Index == -1 )
            continue;
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntPushTwo( Vec_WecEntry(vXorMap, Index), iObj, Truth );
        else
            Vec_IntPushTwo( Vec_WecEntry(vMajMap, Index), iObj, Truth );
    }
    Vec_IntFree( vIndex );
    // create pairs
    Vec_IntForEachEntry( vIndexRev, Value, i )
    {
        Vec_Int_t * vXorOne = Vec_WecEntry( vXorMap, i );
        Vec_Int_t * vMajOne = Vec_WecEntry( vMajMap, i );
        Hash_IntObj_t * pObj = Hash_IntObj( p, Value );
        Vec_IntForEachEntryDouble( vXorOne, iObj, Truth, j )
        Vec_IntForEachEntryDouble( vMajOne, iObj2, Truth2, k )
        {
            int SignAnd[8] = {0x88, 0x44, 0x22, 0x11, 0x77, 0xBB, 0xDD, 0xEE};
            int SignMaj[8] = {0xE8, 0xD4, 0xB2, 0x71, 0x8E, 0x4D, 0x2B, 0x17};
            int n, SignXor = (Truth == 0x99 || Truth == 0x69) << 3;
            for ( n = 0; n < 8; n++ )
                if ( Truth2 == SignMaj[n] )
                    break;
            if ( n == 8 ) 
                for ( n = 0; n < 8; n++ )
                    if ( Truth2 == SignAnd[n] )
                        break;
            assert( n < 8 );
            Vec_IntPushThree( vAdds, pObj->iData0, pObj->iData1, pObj->iData2 ); 
            Vec_IntPushThree( vAdds, iObj, iObj2, SignXor | n );
        }
    }
    Vec_IntFree( vIndexRev );
    Vec_WecFree( vXorMap );
    Vec_WecFree( vMajMap );
    return vAdds;
}